

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_space_time_stack.cpp
# Opt level: O0

void __thiscall KokkosTools::SpaceTimeStack::State::State(State *this)

{
  Allocations *local_88;
  Allocations *local_68;
  allocator<char> local_31;
  string local_30;
  State *local_10;
  State *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"",&local_31);
  StackNode::StackNode(&this->stack_root,(StackNode *)0x0,&local_30,STACK_REGION);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  this->stack_frame = &this->stack_root;
  local_68 = this->current_allocations;
  do {
    Allocations::Allocations(local_68);
    local_68 = local_68 + 1;
  } while (local_68 != this->hwm_allocations);
  local_88 = this->hwm_allocations;
  do {
    Allocations::Allocations(local_88);
    local_88 = local_88 + 1;
  } while ((State *)local_88 != this + 1);
  StackNode::begin(this->stack_frame);
  return;
}

Assistant:

State() : stack_root(nullptr, "", STACK_REGION), stack_frame(&stack_root) {
    stack_frame->begin();
  }